

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS
ref_search_nearest_candidates_closer_than
          (REF_SEARCH ref_search,REF_LIST ref_list,REF_DBL *position,REF_DBL distance)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT parent;
  REF_DBL trim_radius;
  REF_DBL distance_local;
  REF_DBL *position_local;
  REF_LIST ref_list_local;
  REF_SEARCH ref_search_local;
  
  _ref_private_macro_code_rss = distance;
  trim_radius = distance;
  distance_local = (REF_DBL)position;
  position_local = (REF_DBL *)ref_list;
  ref_list_local = (REF_LIST)ref_search;
  uVar1 = ref_search_trim(ref_search,0,position,(REF_DBL *)&ref_private_macro_code_rss);
  if (uVar1 == 0) {
    ref_search_local._4_4_ =
         ref_search_touching((REF_SEARCH)ref_list_local,(REF_LIST)position_local,
                             (REF_DBL *)distance_local,_ref_private_macro_code_rss);
    if (ref_search_local._4_4_ == 0) {
      ref_search_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x17f,"ref_search_nearest_candidates_closer_than",(ulong)ref_search_local._4_4_,
             "touches");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x17d,
           "ref_search_nearest_candidates_closer_than",(ulong)uVar1,"trim");
    ref_search_local._4_4_ = uVar1;
  }
  return ref_search_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_search_nearest_candidates_closer_than(
    REF_SEARCH ref_search, REF_LIST ref_list, REF_DBL *position,
    REF_DBL distance) {
  REF_DBL trim_radius;
  REF_INT parent;

  parent = 0;
  trim_radius = distance;
  RSS(ref_search_trim(ref_search, parent, position, &trim_radius), "trim");
  RSS(ref_search_touching(ref_search, ref_list, position, trim_radius),
      "touches");

  return REF_SUCCESS;
}